

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillEBCellFlag
          (Level *this,FabArray<amrex::EBCellFlagFab> *cellflag,Geometry *geom)

{
  Box *bx_in;
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  EBCellFlagFab *this_00;
  element_type *peVar7;
  EBCellFlag *pEVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer ppVar15;
  pointer pIVar16;
  int i;
  int iVar17;
  FabType FVar18;
  int j;
  uint uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int nshrink;
  int iVar23;
  ulong uVar24;
  uint32_t *puVar25;
  uint32_t *puVar26;
  pointer v;
  pointer ppVar27;
  long lVar28;
  int iVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_a8;
  MFIter mfi;
  
  if (this->m_allregular == true) {
    FabArray<amrex::EBCellFlagFab>::setVal<amrex::EBCellFlagFab,_0>(cellflag,(value_type)0xffffffe4)
    ;
    MFIter::MFIter(&mfi,&cellflag->super_FabArrayBase,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      iVar17 = mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar17 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[mfi.currentIndex];
      }
      *(undefined4 *)
       &((cellflag->m_fabs_v).
         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>._M_impl
         .super__Vector_impl_data._M_start[iVar17]->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 0
      ;
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    iVar17 = (cellflag->super_FabArrayBase).n_grow.vect[0];
    mfi._0_12_ = Geometry::periodicity(geom);
    FabArray<amrex::EBCellFlagFab>::ParallelCopy
              (cellflag,&this->m_cellflag,0,0,1,0,iVar17,(Periodicity *)&mfi,COPY);
    mfi._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_a8,
               (Periodicity *)&mfi);
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    r.smallend.vect[0]._0_3_ = 0x10000;
    r.smallend.vect[2] = 0;
    r.bigend.vect[0] = 0;
    r.bigend.vect[1] = 0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    r.smallend.vect[1] = -1;
    MFIter::MFIter(&mfi,&cellflag->super_FabArrayBase,(MFItInfo *)&r);
    while (pIVar16 = local_a8._M_impl.super__Vector_impl_data._M_finish,
          mfi.currentIndex < mfi.endIndex) {
      iVar23 = mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar23 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[mfi.currentIndex];
      }
      this_00 = (cellflag->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar23];
      bx_in = &(this_00->super_BaseFab<amrex::EBCellFlag>).domain;
      peVar7 = (this->m_covered_grids).m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar7->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(peVar7->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data + 8)) {
        pEVar8 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
        iVar23 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
        iVar5 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
        lVar20 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar23)
                       + 1);
        iVar6 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        lVar28 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar5)
                       + 1) * 4;
        for (v = local_a8._M_impl.super__Vector_impl_data._M_start; v != pIVar16; v = v + 1) {
          r.smallend.vect._0_8_ = *(undefined8 *)(bx_in->smallend).vect;
          uVar9 = *(undefined8 *)
                   ((this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect + 2);
          auVar1 = *(undefined1 (*) [12])&(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
          uVar3 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.btype;
          r.bigend.vect[1] = auVar1._4_4_;
          r.bigend.vect[2] = auVar1._8_4_;
          r.smallend.vect[2] = (int)uVar9;
          r.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
          r.btype.itype = uVar3;
          Box::operator+=(&r,v);
          BoxArray::intersections(&this->m_covered_grids,&r,&isects);
          ppVar15 = isects.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar27 = isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar27 != ppVar15;
              ppVar27 = ppVar27 + 1) {
            r.smallend.vect._0_8_ = *(undefined8 *)(ppVar27->second).smallend.vect;
            uVar9 = *(undefined8 *)((ppVar27->second).smallend.vect + 2);
            auVar2 = *(undefined1 (*) [12])&(ppVar27->second).bigend;
            uVar4 = (ppVar27->second).btype;
            r.bigend.vect[1] = auVar2._4_4_;
            r.bigend.vect[2] = auVar2._8_4_;
            r.smallend.vect[2] = (int)uVar9;
            r.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
            r.btype.itype = uVar4;
            Box::operator-=(&r,v);
            auVar14 = _DAT_00718a90;
            auVar13 = _DAT_006f8e90;
            auVar12 = _DAT_006f8e80;
            lVar22 = (long)r.smallend.vect[2];
            uVar19 = r.bigend.vect[0] - r.smallend.vect[0];
            auVar29._4_4_ = 0;
            auVar29._0_4_ = uVar19;
            auVar29._8_4_ = uVar19;
            auVar29._12_4_ = 0;
            puVar25 = (uint32_t *)
                      ((long)&pEVar8[((long)r.smallend.vect[0] + 3) - (long)iVar23].flag +
                      ((lVar22 - iVar6) * lVar28 + (long)iVar5 * -4 + (long)r.smallend.vect[1] * 4)
                      * lVar20);
            auVar29 = auVar29 ^ _DAT_006f8e90;
            for (; lVar21 = (long)r.smallend.vect[1], puVar26 = puVar25, lVar22 <= r.bigend.vect[2];
                lVar22 = lVar22 + 1) {
              for (; lVar21 <= r.bigend.vect[1]; lVar21 = lVar21 + 1) {
                if (r.smallend.vect[0] <= r.bigend.vect[0]) {
                  uVar24 = 0;
                  do {
                    auVar31._8_4_ = (int)uVar24;
                    auVar31._0_8_ = uVar24;
                    auVar31._12_4_ = (int)(uVar24 >> 0x20);
                    auVar32 = (auVar31 | auVar12) ^ auVar13;
                    iVar30 = auVar29._4_4_;
                    if ((bool)(~(iVar30 < auVar32._4_4_ ||
                                auVar29._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar30) & 1)) {
                      puVar26[uVar24 - 3] = 0x40003;
                    }
                    if (auVar32._12_4_ <= auVar29._12_4_ &&
                        (auVar32._8_4_ <= auVar29._8_4_ || auVar32._12_4_ != auVar29._12_4_)) {
                      puVar26[uVar24 - 2] = 0x40003;
                    }
                    auVar31 = (auVar31 | auVar14) ^ auVar13;
                    iVar33 = auVar31._4_4_;
                    if (iVar33 <= iVar30 && (iVar33 != iVar30 || auVar31._0_4_ <= auVar29._0_4_)) {
                      puVar26[uVar24 - 1] = 0x40003;
                      puVar26[uVar24] = 0x40003;
                    }
                    uVar24 = uVar24 + 4;
                  } while (((ulong)uVar19 + 4 & 0xfffffffffffffffc) != uVar24);
                }
                puVar26 = puVar26 + lVar20;
              }
              puVar25 = (uint32_t *)((long)puVar25 + lVar28 * lVar20);
            }
          }
        }
      }
      *(undefined4 *)&(this_00->super_BaseFab<amrex::EBCellFlag>).field_0x44 = 100;
      FVar18 = EBCellFlagFab::getType(this_00,bx_in);
      *(FabType *)&(this_00->super_BaseFab<amrex::EBCellFlag>).field_0x44 = FVar18;
      for (iVar23 = 1; iVar23 < iVar17; iVar23 = iVar23 + 1) {
        uVar9 = *(undefined8 *)(bx_in->smallend).vect;
        uVar10 = *(undefined8 *)
                  ((this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect + 2);
        uVar11 = *(undefined8 *)((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect + 2)
        ;
        r.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)
                           (this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect >> 0x20);
        r.bigend.vect[2] = (int)uVar11;
        r.btype.itype = (uint)((ulong)uVar11 >> 0x20);
        r.smallend.vect[2] = (int)uVar10;
        r.bigend.vect[0] = (int)((ulong)uVar10 >> 0x20);
        r.smallend.vect[0] = (int)uVar9;
        r.smallend.vect[1] = (int)((ulong)uVar9 >> 0x20);
        r.smallend.vect[2] = r.smallend.vect[2] + iVar23;
        r.bigend.vect[0] = r.bigend.vect[0] - iVar23;
        r.smallend.vect[1] = r.smallend.vect[1] + iVar23;
        r.smallend.vect[0] = r.smallend.vect[0] + iVar23;
        r.bigend.vect[1] = r.bigend.vect[1] - iVar23;
        r.bigend.vect[2] = r.bigend.vect[2] - iVar23;
        EBCellFlagFab::getType(this_00,&r);
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
    std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_a8);
  }
  return;
}

Assistant:

void
Level::fillEBCellFlag (FabArray<EBCellFlagFab>& cellflag, const Geometry& geom) const
{
    if (isAllRegular()) {
        cellflag.setVal(EBCellFlag::TheDefaultCell());
        for (MFIter mfi(cellflag); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            fab.setType(FabType::regular);
        }
        return;
    }

    const int ng = cellflag.nGrow();

    cellflag.ParallelCopy(m_cellflag,0,0,1,0,ng,geom.periodicity());

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    auto cov_val = EBCellFlag::TheCoveredCell();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(cellflag,MFItInfo().UseDefaultStream()); mfi.isValid(); ++mfi)
        {
            auto& fab = cellflag[mfi];
            auto const& a = fab.array();
            const Box& bx = fab.box();
            if (!m_covered_grids.empty())
            {
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& ibox = is.second-iv;
                        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(ibox, i, j, k,
                        {
                            a(i,j,k) = cov_val;
                        });
                    }
                }
            }

            // fix type for each fab
            fab.setType(FabType::undefined);
            auto typ = fab.getType(bx);
            fab.setType(typ);
            for (int nshrink = 1; nshrink < ng; ++nshrink) {
                const Box& b = amrex::grow(bx,-nshrink);
                fab.getType(b);
            }
        }
    }
}